

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

int * parasail_result_get_score_row(parasail_result_t *result)

{
  parasail_result_extra_rowcols_t *ppVar1;
  int *piVar2;
  
  if (result == (parasail_result_t *)0x0) {
    parasail_result_get_score_row_cold_2();
LAB_004b5250:
    piVar2 = (int *)0x0;
  }
  else {
    if ((~result->flag & 0x50000U) == 0) {
      ppVar1 = (parasail_result_extra_rowcols_t *)((result->field_4).trace)->trace_del_table;
    }
    else {
      if (((uint)result->flag >> 0x12 & 1) == 0) {
        parasail_result_get_score_row_cold_1();
        goto LAB_004b5250;
      }
      ppVar1 = (result->field_4).rowcols;
    }
    piVar2 = ppVar1->score_row;
  }
  return piVar2;
}

Assistant:

int* parasail_result_get_score_row(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_stats_rowcol(result) || parasail_result_is_rowcol(result));
    if (parasail_result_is_stats_rowcol(result)) {
        return result->stats->rowcols->score_row;
    }
    if (parasail_result_is_rowcol(result)) {
        return result->rowcols->score_row;
    }
    return NULL; /* should not reach */
}